

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

FilePathSpecSyntax * __thiscall slang::parsing::Parser::parseFilePathSpec(Parser *this)

{
  BumpAllocator *pBVar1;
  bool bVar2;
  TokenKind TVar3;
  int iVar4;
  SourceLocation SVar5;
  FilePathSpecSyntax *pFVar6;
  undefined4 extraout_var;
  size_t extraout_RDX;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  Token TVar8;
  string_view sVar9;
  Token path;
  Token first;
  SmallVector<char,_40UL> text;
  Token local_a8;
  Token local_98;
  size_t local_88;
  char *pcStack_80;
  string_view local_78;
  SmallVectorBase<char> local_68 [2];
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,StringLiteral);
  if (bVar2) {
    local_68[0]._0_16_ = (undefined1  [16])ParserBase::consume(&this->super_ParserBase);
    pBVar1 = (this->super_ParserBase).alloc;
    sVar7 = Token::trivia((Token *)local_68);
    local_78 = Token::rawText((Token *)local_68);
    SVar5 = Token::location((Token *)local_68);
    Token::Token(&local_98,pBVar1,IncludeFileName,sVar7,local_78,SVar5);
    pFVar6 = slang::syntax::SyntaxFactory::filePathSpec(&this->factory,local_98);
  }
  else {
    TVar8 = ParserBase::peek(&this->super_ParserBase);
    TVar3 = TVar8.kind;
    if (TVar3 < Comma) {
      if ((TVar3 == EndOfFile) || (TVar3 == Semicolon)) {
LAB_0031f164:
        TVar8 = ParserBase::expect(&this->super_ParserBase,IncludeFileName);
        pFVar6 = slang::syntax::SyntaxFactory::filePathSpec(&this->factory,TVar8);
        return pFVar6;
      }
    }
    else if ((TVar3 == Comma) ||
            ((TVar3 == Minus &&
             (TVar8 = ParserBase::peek(&this->super_ParserBase,1), TVar8.kind == IncDirKeyword))))
    goto LAB_0031f164;
    local_68[0].len = 0;
    local_68[0].data_ = (pointer)((long)local_68 + 0x18U);
    local_68[0].cap = 0x28;
    local_98.kind._0_1_ = 0x22;
    SmallVectorBase<char>::emplace_back<char>(local_68,(char *)&local_98);
    local_98 = ParserBase::peek(&this->super_ParserBase);
    do {
      local_a8 = ParserBase::consume(&this->super_ParserBase);
      sVar9 = Token::rawText(&local_a8);
      SmallVectorBase<char>::append<const_char_*>(local_68,sVar9._M_str,sVar9._M_str + sVar9._M_len)
      ;
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      TVar3 = TVar8.kind;
      if (TVar3 < Minus) {
        if (((TVar3 == EndOfFile) || (TVar3 == Semicolon)) || (TVar3 == Comma)) break;
      }
      else if ((TVar3 == Minus) &&
              (TVar8 = ParserBase::peek(&this->super_ParserBase,1), TVar8.kind == IncDirKeyword))
      break;
      local_a8 = ParserBase::peek(&this->super_ParserBase);
      sVar7 = Token::trivia(&local_a8);
    } while (sVar7._M_extent._M_extent_value._M_extent_value == 0);
    local_a8.kind._0_1_ = 0x22;
    SmallVectorBase<char>::emplace_back<char>(local_68,(char *)&local_a8);
    pBVar1 = (this->super_ParserBase).alloc;
    sVar7 = Token::trivia(&local_98);
    iVar4 = SmallVectorBase<char>::copy
                      (local_68,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                       (EVP_PKEY_CTX *)sVar7._M_extent._M_extent_value._M_extent_value);
    pcStack_80 = (char *)CONCAT44(extraout_var,iVar4);
    local_88 = extraout_RDX;
    SVar5 = Token::location(&local_98);
    sVar9._M_str = pcStack_80;
    sVar9._M_len = local_88;
    Token::Token(&local_a8,pBVar1,IncludeFileName,sVar7,sVar9,SVar5);
    pFVar6 = slang::syntax::SyntaxFactory::filePathSpec(&this->factory,local_a8);
    if (local_68[0].data_ != (pointer)((long)local_68 + 0x18U)) {
      operator_delete(local_68[0].data_);
    }
  }
  return pFVar6;
}

Assistant:

FilePathSpecSyntax& Parser::parseFilePathSpec() {
    if (peek(TokenKind::StringLiteral)) {
        auto lit = consume();
        auto path = Token(alloc, TokenKind::IncludeFileName, lit.trivia(), lit.rawText(),
                          lit.location());
        return factory.filePathSpec(path);
    }

    auto nextIsValidPathToken = [&] {
        switch (peek().kind) {
            case TokenKind::Minus:
                return peek(1).kind != TokenKind::IncDirKeyword;
            case TokenKind::Comma:
            case TokenKind::Semicolon:
            case TokenKind::EndOfFile:
                return false;
            default:
                return true;
        }
    };

    if (!nextIsValidPathToken())
        return factory.filePathSpec(expect(TokenKind::IncludeFileName));

    SmallVector<char> text;
    text.push_back('"');

    auto first = peek();
    do {
        text.append_range(consume().rawText());
    } while (nextIsValidPathToken() && peek().trivia().empty());

    text.push_back('"');

    auto path = Token(alloc, TokenKind::IncludeFileName, first.trivia(),
                      toStringView(text.copy(alloc)), first.location());
    return factory.filePathSpec(path);
}